

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_str_insert_at_char(nk_str *s,int pos,char *str,int len)

{
  int iVar1;
  ulong uVar2;
  void *pvVar3;
  nk_size size;
  int iVar4;
  
  iVar4 = 0;
  if (len != 0 && (str != (char *)0x0 && s != (nk_str *)0x0)) {
    uVar2 = (s->buffer).allocated;
    iVar4 = 0;
    if (((ulong)(long)pos <= uVar2) &&
       ((size = (nk_size)len, uVar2 + size < (s->buffer).memory.size ||
        ((s->buffer).type != NK_BUFFER_FIXED)))) {
      iVar4 = (int)uVar2 - pos;
      if (iVar4 == 0) {
        nk_str_append_text_char(s,str,len);
      }
      else {
        pvVar3 = nk_buffer_alloc(&s->buffer,NK_BUFFER_FRONT,size,0);
        if (pvVar3 == (void *)0x0) {
          return 0;
        }
        if (0 < iVar4) {
          pvVar3 = (s->buffer).memory.ptr;
          iVar1 = iVar4 + pos + len;
          do {
            *(undefined1 *)((long)pvVar3 + (long)(iVar1 + -1)) =
                 *(undefined1 *)((long)pvVar3 + (long)((int)uVar2 + -1));
            pvVar3 = (void *)((long)pvVar3 + -1);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        nk_memcopy((void *)((long)pos + (long)(s->buffer).memory.ptr),str,size);
        iVar4 = nk_utf_len((char *)(s->buffer).memory.ptr,(int)(s->buffer).allocated);
        s->len = iVar4;
      }
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

NK_API int
nk_str_insert_at_char(struct nk_str *s, int pos, const char *str, int len)
{
int i;
void *mem;
char *src;
char *dst;

int copylen;
NK_ASSERT(s);
NK_ASSERT(str);
NK_ASSERT(len >= 0);
if (!s || !str || !len || (nk_size)pos > s->buffer.allocated) return 0;
if ((s->buffer.allocated + (nk_size)len >= s->buffer.memory.size) &&
(s->buffer.type == NK_BUFFER_FIXED)) return 0;

copylen = (int)s->buffer.allocated - pos;
if (!copylen) {
nk_str_append_text_char(s, str, len);
return 1;
}
mem = nk_buffer_alloc(&s->buffer, NK_BUFFER_FRONT, (nk_size)len * sizeof(char), 0);
if (!mem) return 0;

/* memmove */
NK_ASSERT(((int)pos + (int)len + ((int)copylen - 1)) >= 0);
NK_ASSERT(((int)pos + ((int)copylen - 1)) >= 0);
dst = nk_ptr_add(char, s->buffer.memory.ptr, pos + len + (copylen - 1));
src = nk_ptr_add(char, s->buffer.memory.ptr, pos + (copylen-1));
for (i = 0; i < copylen; ++i) *dst-- = *src--;
mem = nk_ptr_add(void, s->buffer.memory.ptr, pos);
NK_MEMCPY(mem, str, (nk_size)len * sizeof(char));
s->len = nk_utf_len((char *)s->buffer.memory.ptr, (int)s->buffer.allocated);
return 1;
}